

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O0

UResourceBundle *
ures_getNextResource_63(UResourceBundle *resB,UResourceBundle *fillIn,UErrorCode *status)

{
  UBool UVar1;
  uint uVar2;
  Resource RVar3;
  UResourceBundle *pUVar4;
  char *pcStack_30;
  Resource r;
  char *key;
  UErrorCode *status_local;
  UResourceBundle *fillIn_local;
  UResourceBundle *resB_local;
  
  pcStack_30 = (char *)0x0;
  status_local = (UErrorCode *)fillIn;
  if ((status == (UErrorCode *)0x0) ||
     (key = (char *)status, fillIn_local = resB, UVar1 = U_FAILURE(*status), UVar1 != '\0')) {
    resB_local = (UResourceBundle *)status_local;
  }
  else if (fillIn_local == (UResourceBundle *)0x0) {
    key[0] = '\x01';
    key[1] = '\0';
    key[2] = '\0';
    key[3] = '\0';
    resB_local = (UResourceBundle *)status_local;
  }
  else if (fillIn_local->fIndex == fillIn_local->fSize + -1) {
    key[0] = '\b';
    key[1] = '\0';
    key[2] = '\0';
    key[3] = '\0';
    resB_local = (UResourceBundle *)status_local;
  }
  else {
    fillIn_local->fIndex = fillIn_local->fIndex + 1;
    uVar2 = fillIn_local->fRes >> 0x1c;
    if (1 < uVar2) {
      if ((uVar2 == 2) || (uVar2 - 4 < 2)) {
        RVar3 = res_getTableItemByIndex_63
                          (&fillIn_local->fResData,fillIn_local->fRes,fillIn_local->fIndex,
                           &stack0xffffffffffffffd0);
        pUVar4 = init_resb_result(&fillIn_local->fResData,RVar3,pcStack_30,fillIn_local->fIndex,
                                  fillIn_local->fData,fillIn_local,0,(UResourceBundle *)status_local
                                  ,(UErrorCode *)key);
        return pUVar4;
      }
      if (1 < uVar2 - 6) {
        if (uVar2 - 8 < 2) {
          RVar3 = res_getArrayItem_63(&fillIn_local->fResData,fillIn_local->fRes,
                                      fillIn_local->fIndex);
          pUVar4 = init_resb_result(&fillIn_local->fResData,RVar3,pcStack_30,fillIn_local->fIndex,
                                    fillIn_local->fData,fillIn_local,0,
                                    (UResourceBundle *)status_local,(UErrorCode *)key);
          return pUVar4;
        }
        if (uVar2 != 0xe) {
          return (UResourceBundle *)status_local;
        }
      }
    }
    resB_local = ures_copyResb_63((UResourceBundle *)status_local,fillIn_local,(UErrorCode *)key);
  }
  return resB_local;
}

Assistant:

U_CAPI UResourceBundle* U_EXPORT2 ures_getNextResource(UResourceBundle *resB, UResourceBundle *fillIn, UErrorCode *status) {
    const char *key = NULL;
    Resource r = RES_BOGUS;

    if (status==NULL || U_FAILURE(*status)) {
            /*return NULL;*/
            return fillIn;
    }
    if(resB == NULL) {
            *status = U_ILLEGAL_ARGUMENT_ERROR;
            /*return NULL;*/
            return fillIn;
    }

    if(resB->fIndex == resB->fSize-1) {
      *status = U_INDEX_OUTOFBOUNDS_ERROR;
      /*return NULL;*/
    } else {
        resB->fIndex++;
        switch(RES_GET_TYPE(resB->fRes)) {
        case URES_INT:
        case URES_BINARY:
        case URES_STRING:
        case URES_STRING_V2:
        case URES_INT_VECTOR:
            return ures_copyResb(fillIn, resB, status);
        case URES_TABLE:
        case URES_TABLE16:
        case URES_TABLE32:
            r = res_getTableItemByIndex(&(resB->fResData), resB->fRes, resB->fIndex, &key);
            if(r == RES_BOGUS && resB->fHasFallback) {
                /* TODO: do the fallback */
            }
            return init_resb_result(&(resB->fResData), r, key, resB->fIndex, resB->fData, resB, 0, fillIn, status);
        case URES_ARRAY:
        case URES_ARRAY16:
            r = res_getArrayItem(&(resB->fResData), resB->fRes, resB->fIndex);
            if(r == RES_BOGUS && resB->fHasFallback) {
                /* TODO: do the fallback */
            }
            return init_resb_result(&(resB->fResData), r, key, resB->fIndex, resB->fData, resB, 0, fillIn, status);
        default:
            /*return NULL;*/
            return fillIn;
        }
    }
    /*return NULL;*/
    return fillIn;
}